

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImPlotRange *pIVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterYs<unsigned_int> *pGVar7;
  TransformerLinLog *pTVar8;
  GetterYRef *pGVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  pIVar17 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar19 = pGVar7->Count;
  dVar2 = pGVar7->XScale;
  dVar3 = pGVar7->X0;
  dVar13 = log10((double)*(uint *)((long)pGVar7->Ys +
                                  (long)(((prim + pGVar7->Offset) % iVar19 + iVar19) % iVar19) *
                                  (long)pGVar7->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar19 = pTVar8->YAxis;
  pIVar1 = &pIVar17->CurrentPlot->YAxis[iVar19].Range;
  dVar14 = pIVar1->Min;
  pGVar9 = this->Getter2;
  pTVar8 = this->Transformer;
  IVar4 = pIVar17->PixelRange[iVar19].Min;
  fVar22 = (float)(pIVar17->My[iVar19] *
                   ((dVar14 + (double)(float)(dVar13 / pIVar17->LogDenY[iVar19]) *
                              (pIVar1->Max - dVar14)) - dVar14) + (double)IVar4.y);
  fVar23 = (float)(pIVar17->Mx *
                   ((dVar3 + (double)prim * dVar2) - (pIVar17->CurrentPlot->XAxis).Range.Min) +
                  (double)IVar4.x);
  dVar2 = pGVar9->XScale;
  dVar3 = pGVar9->X0;
  dVar14 = log10(pGVar9->YRef / GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar19 = pTVar8->YAxis;
  pIVar10 = pIVar18->CurrentPlot;
  dVar13 = pIVar10->YAxis[iVar19].Range.Min;
  IVar4 = pIVar18->PixelRange[iVar19].Min;
  fVar20 = (float)(pIVar18->Mx * ((dVar3 + (double)prim * dVar2) - (pIVar10->XAxis).Range.Min) +
                  (double)IVar4.x);
  fVar21 = (float)(pIVar18->My[iVar19] *
                   ((dVar13 + (double)(float)(dVar14 / pIVar18->LogDenY[iVar19]) *
                              (pIVar10->YAxis[iVar19].Range.Max - dVar13)) - dVar13) +
                  (double)IVar4.y);
  auVar27._0_4_ = ~-(uint)(fVar20 <= fVar23) & (uint)fVar20;
  auVar27._4_4_ = ~-(uint)(fVar21 <= fVar22) & (uint)fVar21;
  auVar27._8_4_ = ~-(uint)(fVar23 < fVar20) & (uint)fVar20;
  auVar27._12_4_ = ~-(uint)(fVar22 < fVar21) & (uint)fVar21;
  auVar15._4_4_ = (uint)fVar22 & -(uint)(fVar21 <= fVar22);
  auVar15._0_4_ = (uint)fVar23 & -(uint)(fVar20 <= fVar23);
  auVar15._8_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar20);
  auVar15._12_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar21);
  auVar27 = auVar27 | auVar15;
  fVar24 = (cull_rect->Min).y;
  auVar29._4_4_ = -(uint)(fVar24 < auVar27._4_4_);
  auVar29._0_4_ = -(uint)((cull_rect->Min).x < auVar27._0_4_);
  auVar16._4_8_ = auVar27._8_8_;
  auVar16._0_4_ = -(uint)(auVar27._4_4_ < fVar24);
  auVar28._0_8_ = auVar16._0_8_ << 0x20;
  auVar28._8_4_ = -(uint)(auVar27._8_4_ < (cull_rect->Max).x);
  auVar28._12_4_ = -(uint)(auVar27._12_4_ < (cull_rect->Max).y);
  auVar29._8_8_ = auVar28._8_8_;
  iVar19 = movmskps((int)pIVar10,auVar29);
  if (iVar19 == 0xf) {
    IVar5 = this->Col;
    IVar4 = *uv;
    fVar24 = fVar20 - fVar23;
    fVar25 = fVar21 - fVar22;
    fVar26 = fVar24 * fVar24 + fVar25 * fVar25;
    if (0.0 < fVar26) {
      fVar26 = 1.0 / SQRT(fVar26);
      fVar24 = fVar24 * fVar26;
      fVar25 = fVar25 * fVar26;
    }
    fVar26 = this->Weight * 0.5;
    pIVar11 = DrawList->_VtxWritePtr;
    fVar24 = fVar26 * fVar24;
    fVar26 = fVar26 * fVar25;
    (pIVar11->pos).x = fVar26 + fVar23;
    (pIVar11->pos).y = fVar22 - fVar24;
    (pIVar11->uv).x = IVar4.x;
    (pIVar11->uv).y = IVar4.y;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar5;
    pIVar11[1].pos.x = fVar26 + fVar20;
    pIVar11[1].pos.y = fVar21 - fVar24;
    pIVar11[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar5;
    pIVar11[2].pos.x = fVar20 - fVar26;
    pIVar11[2].pos.y = fVar21 + fVar24;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar5;
    pIVar11[3].pos.x = fVar23 - fVar26;
    pIVar11[3].pos.y = fVar24 + fVar22;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar12 = DrawList->_IdxWritePtr;
    *puVar12 = uVar6;
    puVar12[1] = uVar6 + 1;
    puVar12[2] = DrawList->_VtxCurrentIdx + 2;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar12[3] = uVar6;
    puVar12[4] = uVar6 + 2;
    puVar12[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar12 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return (char)iVar19 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }